

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O2

void __thiscall SCCTest_DerefPostIncrement_Test::TestBody(SCCTest_DerefPostIncrement_Test *this)

{
  char *message;
  Iterator IVar1;
  undefined1 local_e0 [8];
  GraphSCCs sccs;
  Iterator it;
  Graph_conflict1 graph;
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  Graph::Graph((Graph *)&it.val,1);
  GraphSCCs::GraphSCCs((GraphSCCs *)local_e0,(Graph_conflict1 *)&it.val);
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)::wasm::SCCs<IntIt,_GraphSCCs>::begin((SCCs<IntIt,_GraphSCCs> *)local_e0);
  join_0x00000010_0x00000000_ =
       ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::begin
                 ((SCC *)&graph.graph.
                          super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  IVar1 = ::wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::operator++((Iterator *)&sccs.graph,0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       IVar1.val.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  local_18.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)
             &graph.graph.
              super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"*it++","0u",
             (uint *)&gtest_ar.message_,(uint *)&local_18);
  if ((char)graph.graph.
            super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x95,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT44(gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  ::wasm::SCCs<IntIt,_GraphSCCs>::~SCCs((SCCs<IntIt,_GraphSCCs> *)local_e0);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&it.val);
  return;
}

Assistant:

TEST(SCCTest, DerefPostIncrement) {
  // Valid input iterators must have *it++ yield the value from before the
  // increment.
  Graph graph(1);
  GraphSCCs sccs(graph);
  auto it = sccs.begin()->begin();
  EXPECT_EQ(*it++, 0u);
}